

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  undefined8 *puVar2;
  format_specs specs;
  num_writer f;
  bool bVar3;
  char cVar4;
  bool bVar5;
  wchar_t wVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var11;
  undefined8 uVar12;
  reference pcVar13;
  undefined8 uVar14;
  char *pcVar15;
  long *in_RDI;
  string_view sVar16;
  const_iterator group;
  int size;
  int num_digits;
  wchar_t sep;
  string groups;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec8;
  locale_ref in_stack_fffffffffffffed0;
  locale_ref in_stack_fffffffffffffed8;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 uVar17;
  undefined4 in_stack_ffffffffffffffb8;
  string local_28 [40];
  
  grouping<wchar_t>(in_stack_fffffffffffffed8);
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    uVar17 = *(undefined8 *)(*in_RDI + 8);
    wVar6 = thousands_sep<wchar_t>(in_stack_fffffffffffffed0);
    if (wVar6 == L'\0') {
      on_dec((int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    }
    else {
      iVar7 = count_digits(in_RDI[2]);
      iVar8 = iVar7;
      _Var11._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        uVar12 = std::__cxx11::string::cend();
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffed0.locale_,in_stack_fffffffffffffec8);
        bVar5 = false;
        if (bVar3) {
          iVar9 = iVar8;
          pcVar13 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&stack0xffffffffffffffa0);
          bVar5 = false;
          bVar3 = *pcVar13 < iVar8;
          iVar8 = iVar9;
          if (bVar3) {
            pcVar13 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&stack0xffffffffffffffa0);
            bVar5 = false;
            iVar8 = iVar9;
            if ('\0' < *pcVar13) {
              pcVar13 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&stack0xffffffffffffffa0);
              cVar1 = *pcVar13;
              cVar4 = max_value<char>();
              bVar5 = cVar1 != cVar4;
              iVar8 = iVar9;
            }
          }
        }
        if (!bVar5) break;
        iVar7 = iVar7 + 1;
        pcVar13 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&stack0xffffffffffffffa0);
        iVar8 = iVar8 - *pcVar13;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xffffffffffffffa0);
      }
      uVar14 = std::__cxx11::string::cend();
      bVar5 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffed0.locale_,in_stack_fffffffffffffec8);
      if (bVar5) {
        iVar9 = iVar8 + -1;
        pcVar15 = (char *)std::__cxx11::string::back();
        iVar7 = iVar9 / (int)*pcVar15 + iVar7;
      }
      sVar16 = get_prefix((int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_> *)0x1fe710);
      puVar2 = (undefined8 *)in_RDI[1];
      specs.fill.data_[1] = (int)uVar14;
      specs.fill.data_[2] = (int)((ulong)uVar14 >> 0x20);
      specs._0_16_ = sVar16;
      specs.fill.data_[3] = (int)uVar12;
      specs.fill.size_ = (char)((ulong)uVar12 >> 0x20);
      specs.fill._17_3_ = (int3)((ulong)uVar12 >> 0x28);
      f.size = iVar7;
      f.abs_value = (unsigned_type)_Var11._M_current;
      f._12_4_ = iVar8;
      f.groups = (string *)uVar17;
      f.sep = in_stack_ffffffffffffffb8;
      f._28_4_ = wVar6;
      basic_writer<fmt::v6::buffer_range<wchar_t>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<long_long,fmt::v6::basic_format_specs<wchar_t>>::num_writer>
                ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)puVar2[1],
                 (int)((ulong)*puVar2 >> 0x20),*(string_view *)(puVar2 + 2),specs,f);
    }
  }
  else {
    on_dec((int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_> *)
           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }